

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_gc_mark_protected *t)

{
  MDD *pMVar1;
  long lVar2;
  uint64_t *puStack_30;
  
  lVar2 = 0;
  puStack_30 = protect_iter(&lddmc_protected,0,lddmc_protected.refs_size);
  while (puStack_30 != (uint64_t *)0x0) {
    pMVar1 = (MDD *)protect_next(&lddmc_protected,&puStack_30,lddmc_protected.refs_size);
    lddmc_gc_mark_rec_SPAWN(w,__dq_head,*pMVar1);
    __dq_head = __dq_head + 1;
    lVar2 = lVar2 + -1;
  }
  for (; __dq_head = __dq_head + -1, lVar2 != 0; lVar2 = lVar2 + 1) {
    lddmc_gc_mark_rec_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&lddmc_protected, 0, lddmc_protected.refs_size);
    while (it != NULL) {
        MDD *to_mark = (MDD*)protect_next(&lddmc_protected, &it, lddmc_protected.refs_size);
        SPAWN(lddmc_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}